

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::hex_int(sequence *__return_storage_ptr__,spec *s)

{
  repeat_at_least rStack_118;
  literal local_100;
  sequence local_e8;
  either local_c8;
  hexdig local_a8;
  hexdig local_80;
  hexdig local_58;
  character local_30;
  
  local_100.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004e8a18;
  local_100.value_ = "0x";
  local_100.size_ = 2;
  hexdig::hexdig(&local_80,s);
  hexdig::hexdig(&local_a8,s);
  local_30.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004e8900;
  local_30.value_ = '_';
  hexdig::hexdig(&local_58,s);
  sequence::sequence<toml::detail::character,toml::detail::syntax::hexdig>
            (&local_e8,&local_30,&local_58);
  either::either<toml::detail::syntax::hexdig,toml::detail::sequence>(&local_c8,&local_a8,&local_e8)
  ;
  repeat_at_least::repeat_at_least<toml::detail::either>(&rStack_118,0,&local_c8);
  sequence::
  sequence<toml::detail::literal,toml::detail::syntax::hexdig,toml::detail::repeat_at_least>
            (__return_storage_ptr__,&local_100,&local_80,&rStack_118);
  if (rStack_118.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        rStack_118.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  rStack_118.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_c8.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_e8.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_58.scanner_.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_a8.scanner_.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_80.scanner_.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence hex_int(const spec& s)
{
    return sequence(
            literal("0x"),
            hexdig(s),
            repeat_at_least(0,
                either(
                    hexdig(s),
                    sequence(character(char_type('_')), hexdig(s))
                )
            )
        );
}